

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O3

uint * Cec_ManSimSimRef(Cec_ManSim_t *p,int i)

{
  uint *puVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  
  piVar2 = p->pSimInfo;
  if (piVar2[i] != 0) {
    __assert_fail("p->pSimInfo[i] == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecClass.c"
                  ,0x197,"unsigned int *Cec_ManSimSimRef(Cec_ManSim_t *, int)");
  }
  iVar3 = p->MemFree;
  if (iVar3 != 0) goto LAB_005a8276;
  iVar3 = p->nWordsAlloc;
  puVar1 = p->pMems;
  if ((long)iVar3 == 0) {
    if (puVar1 != (uint *)0x0) {
      __assert_fail("p->pMems == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/cec/cecClass.c"
                    ,0x19c,"unsigned int *Cec_ManSimSimRef(Cec_ManSim_t *, int)");
    }
    p->nWordsAlloc = 0x40000;
    p->nMems = 1;
    iVar4 = 0x40000;
LAB_005a8257:
    puVar1 = (uint *)malloc((long)iVar4 << 2);
  }
  else {
    iVar4 = iVar3 * 2;
    p->nWordsAlloc = iVar4;
    if (puVar1 == (uint *)0x0) goto LAB_005a8257;
    puVar1 = (uint *)realloc(puVar1,(long)iVar3 << 3);
  }
  p->pMems = puVar1;
  Cec_ManSimMemRelink(p);
  iVar3 = p->MemFree;
  piVar2 = p->pSimInfo;
LAB_005a8276:
  piVar2[i] = iVar3;
  iVar3 = p->MemFree;
  p->MemFree = p->pMems[iVar3];
  if ((-1 < i) && (i < p->pAig->nObjs)) {
    puVar1 = p->pMems + iVar3;
    *puVar1 = p->pAig->pObjs[(uint)i].Value;
    iVar4 = p->nMems;
    iVar3 = iVar4 + 1;
    p->nMems = iVar3;
    if (p->nMemsMax <= iVar4) {
      p->nMemsMax = iVar3;
    }
    return puVar1;
  }
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

unsigned * Cec_ManSimSimRef( Cec_ManSim_t * p, int i )
{
    unsigned * pSim;
    assert( p->pSimInfo[i] == 0 );
    if ( p->MemFree == 0 )
    {
        if ( p->nWordsAlloc == 0 )
        {
            assert( p->pMems == NULL );
            p->nWordsAlloc = (1<<17); // -> 1Mb
            p->nMems = 1;
        }
        p->nWordsAlloc *= 2;
        p->pMems = ABC_REALLOC( unsigned, p->pMems, p->nWordsAlloc );
        Cec_ManSimMemRelink( p );
    }
    p->pSimInfo[i] = p->MemFree;
    pSim = p->pMems + p->MemFree;
    p->MemFree = pSim[0];
    pSim[0] = Gia_ObjValue( Gia_ManObj(p->pAig, i) );
    p->nMems++;
    if ( p->nMemsMax < p->nMems )
        p->nMemsMax = p->nMems;
    return pSim;
}